

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImU32 IVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  lVar2 = (long)(this->IDStack).Size;
  if (0 < lVar2) {
    fVar3 = (this->Pos).x;
    fVar4 = (this->Pos).y;
    local_18 = (int)((r_abs->Min).x - fVar3);
    iStack_14 = (int)((r_abs->Min).y - fVar4);
    iStack_10 = (int)((r_abs->Max).x - fVar3);
    iStack_c = (int)((r_abs->Max).y - fVar4);
    IVar1 = ImHash(&local_18,0x10,(this->IDStack).Data[lVar2 + -1]);
    if (GImGui->ActiveId == IVar1) {
      GImGui->ActiveIdIsAlive = true;
    }
    return IVar1;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                ,0x4a4,"value_type &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    const int r_rel[4] = { (int)(r_abs.Min.x - Pos.x), (int)(r_abs.Min.y - Pos.y), (int)(r_abs.Max.x - Pos.x), (int)(r_abs.Max.y - Pos.y) };
    ImGuiID id = ImHash(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}